

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCom.c
# Opt level: O0

int If_CommandPrintBox(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  FILE *pFile;
  int iVar2;
  FILE *__stream;
  If_LibBox_t *p;
  char *pcVar3;
  int c;
  int fVerbose;
  Abc_Ntk_t *pNet;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  bVar1 = true;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), pFile = _stdout, iVar2 != -1) {
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_004d0ee5;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (argc == globalUtilOptind) {
    p = (If_LibBox_t *)Abc_FrameReadLibBox();
    If_LibBoxPrint(pFile,p);
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_004d0ee5:
    fprintf(__stream,"\nusage: print_box [-vh]\n");
    fprintf(__stream,"\t          print the current box library\n");
    pcVar3 = "no";
    if (bVar1) {
      pcVar3 = "yes";
    }
    fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar3);
    fprintf(__stream,"\t-h      : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int If_CommandPrintBox( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNet;
    int fVerbose;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "vh")) != EOF ) 
    {
        switch (c) 
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;

    // set the new network
    If_LibBoxPrint( stdout, (If_LibBox_t *)Abc_FrameReadLibBox() );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_box [-vh]\n");
    fprintf( pErr, "\t          print the current box library\n" );  
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       /* error exit */
}